

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall luna::OpenFileFail::OpenFileFail(OpenFileFail *this,string *file)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000188;
  Exception *in_stack_00000190;
  
  Exception::Exception((Exception *)0x20631c);
  Exception::SetWhat<std::__cxx11::string_const&>(in_stack_00000190,in_stack_00000188);
  return;
}

Assistant:

explicit OpenFileFail(const std::string &file)
        {
            SetWhat(file);
        }